

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O0

int Unm_ManPrintPairStats(Hash_IntMan_t *pHash,int nTotal0,int nPairs0,int nPairs1,int fUseLit)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  uint local_88 [2];
  int Counter [21];
  int nTotal;
  int nPairs;
  int nRefs;
  int Num;
  int i;
  int fUseLit_local;
  int nPairs1_local;
  int nPairs0_local;
  int nTotal0_local;
  Hash_IntMan_t *pHash_local;
  
  Counter[0x14] = 0;
  Counter[0x13] = 0;
  memset(local_88,0,0x54);
  iVar2 = Hash_IntManEntryNum(pHash);
  for (nRefs = 1; nRefs <= iVar2; nRefs = nRefs + 1) {
    iVar3 = Hash_IntObjData2(pHash,nRefs);
    iVar3 = Abc_MinInt(0x14,iVar3);
    Counter[0x13] = iVar3 + Counter[0x13];
    Counter[(long)iVar3 + -2] = Counter[(long)iVar3 + -2] + 1;
    Counter[0x14] = (uint)(1 < iVar3) + Counter[0x14];
  }
  printf("Statistics for pairs appearing less than 20 times:\n");
  for (nRefs = 0; nRefs < 0x15; nRefs = nRefs + 1) {
    if (0 < Counter[(long)nRefs + -2]) {
      uVar1 = Counter[(long)nRefs + -2];
      iVar2 = Counter[(long)nRefs + -2];
      iVar3 = Abc_MaxInt(Counter[0x13],1);
      printf("%3d : %7d  %7.2f %%\n",((double)iVar2 * 100.0 * (double)nRefs) / (double)iVar3,
             (ulong)(uint)nRefs,(ulong)uVar1);
    }
  }
  iVar3 = Abc_MaxInt(nTotal0,1);
  iVar2 = Counter[0x14];
  dVar6 = (double)Counter[0x14];
  iVar4 = Abc_MaxInt(nTotal0,1);
  iVar5 = Abc_MaxInt(nTotal0,1);
  printf("Pairs:  Total = %8d    Init = %8d %7.2f %%    Final = %8d %7.2f %%    Real = %8d %7.2f %%\n"
         ,((double)nPairs0 * 100.0) / (double)iVar3,(dVar6 * 100.0) / (double)iVar4,
         ((double)nPairs1 * 100.0) / (double)iVar5,(ulong)(uint)nTotal0,(ulong)(uint)nPairs0,
         (ulong)(uint)iVar2,(ulong)(uint)nPairs1);
  return Counter[0x14];
}

Assistant:

int Unm_ManPrintPairStats( Hash_IntMan_t * pHash, int nTotal0, int nPairs0, int nPairs1, int fUseLit )
{
    int i, Num, nRefs, nPairs = 0, nTotal = 0, Counter[21] = {0};
    Num = Hash_IntManEntryNum( pHash );
    for ( i = 1; i <= Num; i++ )
    {
        nRefs = Abc_MinInt( 20, Hash_IntObjData2(pHash, i) );
        nTotal += nRefs;
        Counter[nRefs]++;
        nPairs += (nRefs > 1);
/*
        if ( fUseLit )
            printf( "(%c%c, %c%c) %d\n", 
                Abc_LitIsCompl(Hash_IntObjData0(pHash, i)-2) ? '!' : ' ', 
                'a' + Abc_Lit2Var(Hash_IntObjData0(pHash, i)-2), 
                Abc_LitIsCompl(Hash_IntObjData1(pHash, i)-2) ? '!' : ' ', 
                'a' + Abc_Lit2Var(Hash_IntObjData1(pHash, i)-2), nRefs );
        else
            printf( "( %c,  %c) %d\n", 
                'a' + Hash_IntObjData0(pHash, i)-1, 
                'a' + Hash_IntObjData1(pHash, i)-1, nRefs );
*/
//        printf( "(%4d, %4d) %d\n", Hash_IntObjData0(pHash, i), Hash_IntObjData1(pHash, i), nRefs );

    }
    printf( "Statistics for pairs appearing less than 20 times:\n" );
    for ( i = 0; i < 21; i++ )
        if ( Counter[i] > 0 )
            printf( "%3d : %7d  %7.2f %%\n", i, Counter[i], 100.0 * Counter[i] * i / Abc_MaxInt(nTotal, 1) );
    printf( "Pairs:  Total = %8d    Init = %8d %7.2f %%    Final = %8d %7.2f %%    Real = %8d %7.2f %%\n", nTotal0, 
        nPairs0,  100.0 * nPairs0 / Abc_MaxInt(nTotal0, 1), 
        nPairs, 100.0 * nPairs / Abc_MaxInt(nTotal0, 1), 
        nPairs1, 100.0 * nPairs1 / Abc_MaxInt(nTotal0, 1) );
    return nPairs;
}